

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O1

char * mctools_basename_view(mcu8str *path)

{
  uint uVar1;
  char *pcVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  
  pcVar2 = path->c_str;
  uVar1 = path->size;
  pcVar7 = pcVar2 + uVar1;
  iVar4 = mctools_impl_has_winnamespace(path);
  cVar3 = mctools_drive_letter(path);
  if (pcVar2 + (ulong)(cVar3 != '\0') * 2 + (ulong)(iVar4 != 0) * 4 != pcVar7) {
    pcVar6 = pcVar2 + uVar1;
    do {
      pcVar5 = pcVar6;
      pcVar6 = pcVar5 + -1;
      if ((pcVar6 <= pcVar2 + (ulong)(cVar3 != '\0') * 2 + (ulong)(iVar4 != 0) * 4) ||
         (*pcVar6 == '\\')) break;
    } while (*pcVar6 != '/');
    if ((*pcVar6 != '/') && (*pcVar6 != '\\')) {
      pcVar5 = pcVar6;
    }
    if ((pcVar5 + 1 != pcVar7) || (*pcVar5 != '.')) {
      pcVar7 = pcVar5;
    }
  }
  return pcVar7;
}

Assistant:

const char * mctools_basename_view( const mcu8str* path )
  {
    const char * itB = path->c_str;
    const char * itE = path->c_str + path->size;
    if ( mctools_impl_has_winnamespace( path ) )
      itB += 4;//skip '\\?\'
    if ( mctools_drive_letter( path ) )
      itB += 2;//skip drive letter
    if ( itB == itE )
      return itE;//empty
    //Find last path sep:
    const char * it = itE - 1;
    while ( it > itB && *it!='/' && *it!='\\' )
      --it;
    if ( *it=='/' || *it=='\\' )
      ++it;
    if ( it+1 == itE && *it == '.' )
      return itE;//empty
    return it;
  }